

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitUic(cmQtAutoGenInitializer *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__y;
  cmGeneratorTarget *pcVar1;
  pointer pbVar2;
  cmQtAutoGenInitializer *pcVar3;
  bool bVar4;
  cmMakefile *this_00;
  char *__s;
  string *in_base;
  mapped_type *pmVar5;
  string *path;
  pointer pbVar6;
  allocator<char> local_7a;
  allocator<char> local_79;
  cmQtAutoGenInitializer *local_78;
  string usp;
  anon_class_8_1_8991fb9c UicGetOpts;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  pcVar1 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&UicGetOpts,"AUTOUIC_SEARCH_PATHS",&local_79);
  __s = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&UicGetOpts);
  std::__cxx11::string::string<std::allocator<char>>((string *)&usp,__s,&local_7a);
  std::__cxx11::string::~string((string *)&UicGetOpts);
  if (usp._M_string_length != 0) {
    cmSystemTools::ExpandListArgument(&usp,&(this->Uic).SearchPaths,false);
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    pbVar2 = (this->Uic).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->Uic).SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      cmsys::SystemTools::CollapseFullPath((string *)&UicGetOpts,pbVar6,in_base);
      std::__cxx11::string::operator=((string *)pbVar6,(string *)&UicGetOpts);
      std::__cxx11::string::~string((string *)&UicGetOpts);
    }
  }
  std::__cxx11::string::~string((string *)&usp);
  UicGetOpts.this = this;
  InitUic::anon_class_8_1_8991fb9c::operator()
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&usp,&UicGetOpts,&this->ConfigDefault);
  __y = &(this->Uic).Options;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(__y,&usp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usp);
  local_78 = this;
  if (this->MultiConfig == true) {
    pbVar2 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      InitUic::anon_class_8_1_8991fb9c::operator()
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&usp,&UicGetOpts,pbVar6);
      bVar4 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&usp,__y);
      if (bVar4) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&(this->Uic).ConfigOptions,pbVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(pmVar5,&usp);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&usp);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usp,"uic",(allocator<char> *)&UicGetOpts);
  pcVar3 = local_78;
  bVar4 = GetQtExecutable(local_78,&(local_78->Uic).super_GenVarsT,&usp,true);
  std::__cxx11::string::~string((string *)&usp);
  if ((bVar4) &&
     (pcVar1 = (pcVar3->Uic).super_GenVarsT.ExecutableTarget, pcVar1 != (cmGeneratorTarget *)0x0)) {
    std::
    _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
    ::_M_insert_unique<cmTarget*const&>
              ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                *)&(pcVar3->AutogenTarget).DependTargets,&pcVar1->Target);
  }
  return bVar4;
}

Assistant:

bool cmQtAutoGenInitializer::InitUic()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();

  // Uic search paths
  {
    std::string const usp =
      this->Target->GetSafeProperty("AUTOUIC_SEARCH_PATHS");
    if (!usp.empty()) {
      cmSystemTools::ExpandListArgument(usp, this->Uic.SearchPaths);
      std::string const& srcDir = makefile->GetCurrentSourceDirectory();
      for (std::string& path : this->Uic.SearchPaths) {
        path = cmSystemTools::CollapseFullPath(path, srcDir);
      }
    }
  }
  // Uic target options
  {
    auto UicGetOpts =
      [this](std::string const& cfg) -> std::vector<std::string> {
      std::vector<std::string> opts;
      this->Target->GetAutoUicOptions(opts, cfg);
      return opts;
    };

    // Default settings
    this->Uic.Options = UicGetOpts(this->ConfigDefault);

    // Configuration specific settings
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::vector<std::string> options = UicGetOpts(cfg);
        if (options != this->Uic.Options) {
          this->Uic.ConfigOptions[cfg] = std::move(options);
        }
      }
    }
  }

  // Uic executable
  {
    if (!this->GetQtExecutable(this->Uic, "uic", true)) {
      return false;
    }
    // Let the _autogen target depend on the uic executable
    if (this->Uic.ExecutableTarget != nullptr) {
      this->AutogenTarget.DependTargets.insert(
        this->Uic.ExecutableTarget->Target);
    }
  }

  return true;
}